

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

int unpackIfAllDigits(char *input)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  byte bVar9;
  char *s;
  byte *pbVar10;
  
  pbVar8 = (byte *)(input + ((*input & 0xdfU) == 0x41));
  pbVar10 = (byte *)0x0;
  while( true ) {
    bVar1 = *pbVar8;
    uVar7 = (ulong)bVar1;
    if ((((uVar7 == 0) || (pbVar8[2] == 0)) || (pbVar8[2] == 0x2d)) || (bVar1 == 0x2d)) break;
    pbVar4 = pbVar8;
    if ((uVar7 != 0x2e || pbVar10 != (byte *)0x0) &&
       (pbVar4 = pbVar10, 9 < (byte)decodeChar_decode_chars[uVar7])) {
      return 0;
    }
    pbVar8 = pbVar8 + 1;
    pbVar10 = pbVar4;
  }
  if (pbVar10 == (byte *)0x0) {
    return 0;
  }
  if ((byte)(*input | 0x20U) == 0x61) {
    iVar3 = 0x3e0;
    if ((bVar1 | 0x20) != 0x61) {
      iVar3 = (int)(char)decodeChar_decode_chars[uVar7] << 5;
    }
    if ((pbVar8[1] | 0x20) == 0x61) {
      iVar5 = 0x1f;
    }
    else {
      iVar5 = (int)(char)decodeChar_decode_chars[pbVar8[1]];
    }
    iVar5 = iVar5 + iVar3;
    *input = (char)(iVar5 / 100) + '0';
    *pbVar8 = (char)((long)((ulong)(uint)((int)((long)iVar5 / 10) >> 0x1f) << 0x20 |
                           (long)iVar5 / 10 & 0xffffffffU) % 10) + 0x30;
    pbVar8[1] = (char)(iVar5 % 10) + 0x30;
    return 1;
  }
  bVar9 = (bVar1 + 0xbf) * '@' | (byte)(bVar1 + 0xbf) >> 2;
  if (0xd < bVar9) {
    return 0;
  }
  if ((0x2323U >> (bVar9 & 0x1f) & 1) == 0) {
    return 0;
  }
  bVar1 = (bVar1 + 0xbb) * '\x10' | (byte)(bVar1 + 0xbb) >> 4;
  iVar3 = 0;
  if (bVar1 < 4) {
    iVar3 = *(int *)(&DAT_00254e50 + (ulong)bVar1 * 4);
  }
  bVar1 = pbVar8[1] + 0xbf;
  bVar1 = bVar1 * '@' | bVar1 >> 2;
  if (bVar1 < 0xe) {
    if ((0x101U >> (bVar1 & 0x1f) & 1) != 0) {
      uVar6 = iVar3 + 0x1f;
      goto LAB_001cd5e5;
    }
    if ((0x202U >> (bVar1 & 0x1f) & 1) == 0) {
      if ((0x2020U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_001cd608;
      iVar5 = 0x21;
    }
    else {
      iVar5 = 0x20;
    }
  }
  else {
LAB_001cd608:
    iVar5 = (int)(char)decodeChar_decode_chars[pbVar8[1]];
    if ((char)decodeChar_decode_chars[pbVar8[1]] < '\0') {
      return -0x129;
    }
  }
  uVar6 = iVar3 + iVar5;
  if (99 < uVar6) {
    return -0x127;
  }
LAB_001cd5e5:
  uVar2 = (ushort)uVar6 & 0xff;
  *pbVar8 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(byte)(uVar2 / 10)];
  pbVar8[1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(byte)(uVar2 % 10)];
  return 1;
}

Assistant:

static int unpackIfAllDigits(char *input) {
    char *s = input;
    char *dotpos = NULL;
    const int aonly = ((*s == 'A') || (*s == 'a'));
    if (aonly) {
        s++;
    } // v1.50
    for (; *s != 0 && s[2] != 0 && s[2] != '-'; s++) {
        if (*s == '-') {
            break;
        } else if (*s == '.' && !dotpos) {
            dotpos = s;
        } else if ((decodeChar(*s) < 0) || (decodeChar(*s) > 9)) {
            return 0;
        }  // nondigit, so stop
    }

    if (dotpos) {
        if (aonly) // v1.50 encoded only with A's
        {
            const int v = (((s[0] == 'A') || (s[0] == 'a')) ? 31 : decodeChar(s[0])) * 32 +
                          (((s[1] == 'A') || (s[1] == 'a')) ? 31 : decodeChar(s[1]));
            *input = (char) ('0' + (v / 100));
            s[0] = (char) ('0' + ((v / 10) % 10));
            s[1] = (char) ('0' + (v % 10));
            return 1;
        } // v1.50

        if ((*s == 'a') || (*s == 'e') || (*s == 'u') ||
            (*s == 'A') || (*s == 'E') || (*s == 'U')) {
            char *e = s + 1;  // s is vowel, e is lastchar

            int v = 0;
            if (*s == 'e' || *s == 'E') {
                v = 34;
            } else if (*s == 'u' || *s == 'U') {
                v = 68;
            }

            if ((*e == 'a') || (*e == 'A')) {
                v += 31;
            } else if ((*e == 'e') || (*e == 'E')) {
                v += 32;
            } else if ((*e == 'u') || (*e == 'U')) {
                v += 33;
            } else if (decodeChar(*e) < 0) {
                return (int) ERR_INVALID_CHARACTER;
            } else {
                v += decodeChar(*e);
            }

            if (v < 100) {
                *s = ENCODE_CHARS[(unsigned int) v / 10];
                *e = ENCODE_CHARS[(unsigned int) v % 10];
            } else {
                return (int) ERR_INVALID_ENDVOWELS; // mapcodes ends in UE or UU
            }
            return 1;
        }
    }
    return 0; // no vowel just before end
}